

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::NeuralNetworkClassifier::_InternalParse
          (NeuralNetworkClassifier *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  NeuralNetworkLayer *msg;
  string *s;
  uint64_t uVar2;
  NeuralNetworkPreprocessing *msg_00;
  NetworkUpdateParameters *msg_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar3;
  char cVar4;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
LAB_0022063d:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) {
      return local_48;
    }
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    tag_00 = local_3c;
    uVar3 = local_3c >> 3;
    cVar4 = (char)local_3c;
    switch(uVar3) {
    case 1:
      if (cVar4 == '\n') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                          (&this->layers_);
          local_48 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_48);
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\n'));
        goto LAB_0022063d;
      }
      break;
    case 2:
      if (cVar4 == '\x12') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg_00 = google::protobuf::
                   RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::Add
                             (&this->preprocessing_);
          local_48 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg_00->super_MessageLite,local_48);
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\x12'));
        goto LAB_0022063d;
      }
      break;
    case 3:
    case 4:
    case 7:
    case 8:
    case 9:
      break;
    case 5:
      if (cVar4 == '(') {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_48);
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
        this->arrayinputshapemapping_ = (int)uVar2;
        goto LAB_0022063d;
      }
      break;
    case 6:
      if (cVar4 == '0') {
        uVar2 = google::protobuf::internal::ReadVarint64(&local_48);
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
        this->imageinputshapemapping_ = (int)uVar2;
        goto LAB_0022063d;
      }
      break;
    case 10:
      if (cVar4 != 'R') break;
      msg_01 = _internal_mutable_updateparams(this);
LAB_002207f5:
      local_48 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg_01->super_MessageLite,local_48);
      goto joined_r0x0022072d;
    default:
      if (uVar3 == 100) {
        if (cVar4 == '\"') {
          msg_01 = (NetworkUpdateParameters *)_internal_mutable_stringclasslabels(this);
          goto LAB_002207f5;
        }
      }
      else if (uVar3 == 0x65) {
        if (cVar4 == '*') {
          msg_01 = (NetworkUpdateParameters *)_internal_mutable_int64classlabels(this);
          goto LAB_002207f5;
        }
      }
      else if ((uVar3 == 200) && (cVar4 == 'B')) {
        s = _internal_mutable_labelprobabilitylayername_abi_cxx11_(this);
        local_48 = google::protobuf::internal::InlineGreedyStringParser(s,local_48,ctx);
        bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
        if (!bVar1) {
          return (char *)0x0;
        }
        goto joined_r0x0022072d;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
joined_r0x0022072d:
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* NeuralNetworkClassifier::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_layers(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_preprocessing(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 40)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_arrayinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkMultiArrayShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_imageinputshapemapping(static_cast<::CoreML::Specification::NeuralNetworkImageShapeMapping>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          ptr = ctx->ParseMessage(_internal_mutable_updateparams(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringclasslabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64classlabels(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string labelProbabilityLayerName = 200;
      case 200:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_labelprobabilitylayername();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}